

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contains_or_position.hpp
# Opt level: O0

idx_t duckdb::ListSearchSimpleOp<duckdb::uhugeint_t,true>
                (Vector *list_vec,Vector *source_vec,Vector *target_vec,Vector *result,idx_t count)

{
  anon_class_24_3_a294625c fun;
  idx_t iVar1;
  UnifiedVectorFormat *count_00;
  uhugeint_t *puVar2;
  ulong in_RSI;
  Vector *in_RDI;
  idx_t total_matches;
  uhugeint_t *source_data;
  idx_t source_count;
  UnifiedVectorFormat source_format;
  Vector *right;
  idx_t local_98;
  undefined1 in_stack_ffffffffffffff78 [16];
  UnifiedVectorFormat local_70 [96];
  ulong local_10;
  Vector *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(local_70);
  count_00 = (UnifiedVectorFormat *)duckdb::ListVector::GetListSize(local_8);
  duckdb::Vector::ToUnifiedFormat(local_10,count_00);
  puVar2 = UnifiedVectorFormat::GetData<duckdb::uhugeint_t>(local_70);
  local_98 = 0;
  right = (Vector *)&stack0xffffffffffffff70;
  fun.source_data = (uhugeint_t **)in_stack_ffffffffffffff78._0_8_;
  fun.total_matches = (idx_t *)in_stack_ffffffffffffff78._8_8_;
  fun.source_format = (UnifiedVectorFormat *)puVar2;
  BinaryExecutor::
  ExecuteWithNulls<duckdb::list_entry_t,duckdb::uhugeint_t,int,duckdb::ListSearchSimpleOp<duckdb::uhugeint_t,true>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::list_entry_t_const&,duckdb::uhugeint_t_const&,duckdb::ValidityMask&,unsigned_long)_1_>
            ((Vector *)&local_98,right,(Vector *)local_70,(idx_t)count_00,fun);
  iVar1 = local_98;
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)right);
  return iVar1;
}

Assistant:

idx_t ListSearchSimpleOp(Vector &list_vec, Vector &source_vec, Vector &target_vec, Vector &result, idx_t count) {

	UnifiedVectorFormat source_format;
	const auto source_count = ListVector::GetListSize(list_vec);
	source_vec.ToUnifiedFormat(source_count, source_format);
	const auto source_data = UnifiedVectorFormat::GetData<T>(source_format);

	using RETURN_TYPE = typename std::conditional<RETURN_POSITION, int32_t, int8_t>::type;

	idx_t total_matches = 0;

	BinaryExecutor::ExecuteWithNulls<list_entry_t, T, RETURN_TYPE>(
	    list_vec, target_vec, result, count,
	    [&](const list_entry_t &list, const T &target, ValidityMask &validity, idx_t out_idx) -> RETURN_TYPE {
		    if (list.length == 0) {
			    if (RETURN_POSITION) {
				    validity.SetInvalid(out_idx);
			    }
			    return 0;
		    }

		    for (auto i = list.offset; i < list.offset + list.length; i++) {
			    const auto entry_idx = source_format.sel->get_index(i);
			    if (source_format.validity.RowIsValid(entry_idx) &&
			        Equals::Operation<T>(source_data[entry_idx], target)) {
				    total_matches++;
				    return RETURN_POSITION ? UnsafeNumericCast<RETURN_TYPE>(1 + i - list.offset) : 1;
			    }
		    }

		    if (RETURN_POSITION) {
			    validity.SetInvalid(out_idx);
		    }
		    return 0;
	    });

	return total_matches;
}